

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O3

bool BasicBlock::IsLegalForPathDepBranches(Instr *instr)

{
  IRKind IVar1;
  OpCode OVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  
  if (instr != (Instr *)0x0) {
    do {
      IVar1 = instr->m_kind;
      if (IVar1 == InstrKindBranch) {
LAB_0041c186:
        OVar2 = instr->m_opcode;
        if (OVar2 < ADD) {
          if ((OVar2 != MultiBr) && (OVar2 != Br)) {
            return true;
          }
        }
        else {
          bVar4 = LowererMD::IsUnconditionalBranch(instr);
          if (!bVar4) {
            return true;
          }
        }
        instr = instr[1].m_next;
        if (instr == (Instr *)0x0) {
          return false;
        }
      }
      else {
        if ((IVar1 == InstrKindLabel) || (IVar1 == InstrKindProfiledLabel)) {
LAB_0041c151:
          if (((ulong)instr[1].m_func & 1) != 0) {
            return false;
          }
        }
        else {
          bVar4 = IsLegalOpcodeForPathDepBrFold(instr);
          if (!bVar4) {
            return false;
          }
          IVar1 = instr->m_kind;
          if (IVar1 == InstrKindBranch) goto LAB_0041c186;
          if ((IVar1 == InstrKindProfiledLabel) || (IVar1 == InstrKindLabel)) goto LAB_0041c151;
        }
        instr = instr->m_next;
      }
    } while (instr != (Instr *)0x0);
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar5 = 1;
  bVar4 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                     ,0x1244,"((0))","UNREACHED");
  if (bVar4) {
    *puVar5 = 0;
    return false;
  }
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

bool
BasicBlock::IsLegalForPathDepBranches(IR::Instr* instr)
{
    while (instr)
    {
        if (!instr->IsBranchInstr() && !instr->IsLabelInstr() && !IsLegalOpcodeForPathDepBrFold(instr))
        {
            return false;
        }
        if (instr->IsLabelInstr())
        {
            if (instr->AsLabelInstr()->m_isLoopTop)
            {
                // don't cross over to loops
                return false;
            }
        }
        if (instr->IsBranchInstr())
        {
            IR::BranchInstr* branch = instr->AsBranchInstr();
            if (branch->IsUnconditional())
            {
                if (!branch->GetTarget())
                {
                    return false;
                }
                instr = branch->GetTarget();
            }
            else
            {
                // Found only legal instructions until a conditional branch, build expensive data structures and check provability
                return true;
            }
        }
        else
        {
            instr = instr->m_next;
        }
    }

    Assert(UNREACHED);
    return false;
}